

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::SPxMainSM<double>::duplicateCols(SPxMainSM<double> *this,SPxLPBase<double> *lp,bool *again)

{
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *this_00;
  int *piVar1;
  double dVar2;
  uint uVar3;
  uint _k;
  Item *pIVar4;
  Nonzero<double> *pNVar5;
  Tolerances *pTVar6;
  pointer pdVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  DataKey *pDVar8;
  int *piVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  Result RVar12;
  int iVar13;
  long lVar14;
  pointer pDVar15;
  DuplicateColsPS *pDVar16;
  FixBoundsPS *pFVar17;
  SPxOut *pSVar18;
  long lVar19;
  ulong uVar20;
  SVectorBase<double> *pSVar21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var22;
  int iVar23;
  int iVar24;
  int n;
  long lVar25;
  ulong uVar26;
  int iVar27;
  DSVectorBase<double> *this_03;
  long lVar28;
  ulong uVar29;
  long in_FS_OFFSET;
  double dVar30;
  double dVar31;
  double dVar32;
  Real RVar33;
  undefined1 auVar34 [16];
  element_type *peVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr;
  shared_ptr<soplex::SPxMainSM<double>::PostStep> ptr_6;
  int *perm;
  element_type *local_208;
  undefined8 uStack_200;
  int *idxMem;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  undefined8 uStack_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  ElementCompare compare;
  bool *local_1a8;
  undefined8 local_1a0;
  int local_198;
  int local_194;
  int *local_190;
  undefined8 local_188;
  Array<double> scale;
  shared_ptr<soplex::Tolerances> local_168;
  shared_ptr<soplex::Tolerances> local_158;
  shared_ptr<soplex::Tolerances> local_148;
  shared_ptr<soplex::Tolerances> local_138;
  shared_ptr<soplex::Tolerances> local_128;
  shared_ptr<soplex::Tolerances> local_118;
  shared_ptr<soplex::Tolerances> local_108;
  bool *local_f8;
  ulong local_f0;
  long local_e8;
  DataArray<int> local_e0;
  DataArray<int> local_c8;
  DataArray<int> local_b0;
  int local_98;
  int local_94;
  bool *local_90;
  undefined8 local_88;
  int local_80;
  int local_7c;
  int *local_78;
  undefined8 local_70;
  undefined4 local_64;
  DataArray<int> local_60;
  double local_48;
  undefined8 uStack_40;
  
  RVar12 = removeEmpty(this,lp);
  if (RVar12 == OKAY) {
    local_198 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
    RVar12 = OKAY;
    if (1 < local_198) {
      local_190 = (int *)0x0;
      local_188 = 0x3ff3333333333333;
      local_194 = local_198;
      spx_alloc<int*>(&local_190,local_198);
      iVar27 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      local_78 = (int *)0x0;
      local_70 = 0x3ff3333333333333;
      local_80 = 0;
      if (0 < iVar27) {
        local_80 = iVar27;
      }
      local_7c = 1;
      if (0 < iVar27) {
        local_7c = local_80;
      }
      spx_alloc<int*>(&local_78,local_7c);
      Array<double>::Array
                (&scale,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      idxMem = (int *)0x0;
      local_f8 = again;
      spx_alloc<int*>(&idxMem,(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      piVar9 = idxMem;
      *local_190 = 0;
      *scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = 0.0;
      iVar27 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      *local_78 = iVar27;
      iVar23 = 0;
      if (1 < iVar27) {
        lVar25 = 1;
        iVar23 = 0;
        do {
          local_190[lVar25] = 0;
          scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar25] = 0.0;
          local_78[lVar25] = 0;
          idxMem[lVar25 + -1] = (int)lVar25;
          lVar25 = lVar25 + 1;
          iVar23 = iVar23 + 1;
        } while (lVar25 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      }
      if (0 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
        p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1c8 = 0.0;
        uStack_1c0 = 0;
        do {
          pIVar4 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
          iVar27 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey
                   [(long)p_Var22].idx;
          local_1e8 = p_Var22;
          if (0 < pIVar4[iVar27].data.super_SVectorBase<double>.memused) {
            pIVar4 = pIVar4 + iVar27;
            lVar28 = 8;
            lVar25 = 0;
            do {
              pNVar5 = (pIVar4->data).super_SVectorBase<double>.m_elem;
              local_1d8 = *(double *)((long)pNVar5 + lVar28 + -8);
              iVar27 = *(int *)((long)&pNVar5->val + lVar28);
              dVar30 = scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar27];
              if ((dVar30 == 0.0) && (!NAN(dVar30))) {
                scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar27] = local_1d8;
                dVar30 = local_1d8;
              }
              this_03 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + local_190[iVar27];
              DSVectorBase<double>::makeMem(this_03,1);
              dVar30 = local_1d8 / dVar30;
              if ((dVar30 != 0.0) || (NAN(dVar30))) {
                iVar24 = (this_03->super_SVectorBase<double>).memused;
                pNVar5 = (this_03->super_SVectorBase<double>).m_elem;
                pNVar5[iVar24].idx = iVar27;
                pNVar5[iVar24].val = dVar30;
                (this_03->super_SVectorBase<double>).memused = iVar24 + 1;
              }
              piVar1 = local_78 + local_190[iVar27];
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                lVar19 = (long)iVar23;
                iVar23 = iVar23 + 1;
                piVar9[lVar19] = local_190[iVar27];
              }
              lVar25 = lVar25 + 1;
              iVar27 = (pIVar4->data).super_SVectorBase<double>.memused;
              uVar20 = (ulong)iVar27;
              lVar28 = lVar28 + 0x10;
            } while (lVar25 < (long)uVar20);
            if (0 < iVar27) {
              pDVar15 = (this->m_classSetCols).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar25 = 0;
              do {
                iVar27 = local_190[(pIVar4->data).super_SVectorBase<double>.m_elem[lVar25].idx];
                if (0 < pDVar15[iVar27].super_SVectorBase<double>.memused) {
                  pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  p_Var22 = (this->super_SPxSimplifier<double>)._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                  if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                    }
                  }
                  compare.epsiloncompare = Tolerances::epsilon(pTVar6);
                  if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22);
                  }
                  pDVar15 = (this->m_classSetCols).data.
                            super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  iVar24 = pDVar15[iVar27].super_SVectorBase<double>.memused;
                  if (1 < iVar24) {
                    SPxQuicksort<soplex::Nonzero<double>,soplex::SPxMainSM<double>::ElementCompare>
                              (pDVar15[iVar27].super_SVectorBase<double>.m_elem,iVar24,&compare,0,
                               true);
                    pDVar15 = (this->m_classSetCols).data.
                              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  }
                  iVar24 = *piVar9;
                  lVar28 = (long)iVar23;
                  iVar23 = iVar23 + -1;
                  *piVar9 = piVar9[lVar28 + -1];
                  if (0 < pDVar15[iVar27].super_SVectorBase<double>.memused) {
                    pSVar21 = &pDVar15[iVar27].super_SVectorBase<double>;
                    lVar19 = 0;
                    lVar28 = 0;
                    do {
                      if (lVar19 != 0) {
                        local_1d8 = *(double *)((long)&pSVar21->m_elem->val + lVar19);
                        uStack_1d0 = 0;
                        dVar31 = epsZero(this);
                        uVar20 = (ulong)DAT_005f4110;
                        dVar30 = (double)((ulong)local_1d8 & uVar20);
                        if ((double)((ulong)local_1d8 & uVar20) <=
                            (double)((ulong)local_1c8 & uVar20)) {
                          dVar30 = (double)((ulong)local_1c8 & uVar20);
                        }
                        if (dVar30 <= 1.0) {
                          dVar30 = 1.0;
                        }
                        if (dVar31 < (double)((ulong)((local_1d8 - local_1c8) / dVar30) & uVar20)) {
                          iVar24 = *piVar9;
                          lVar14 = (long)iVar23;
                          iVar23 = iVar23 + -1;
                          *piVar9 = piVar9[lVar14 + -1];
                        }
                      }
                      pDVar15 = (this->m_classSetCols).data.
                                super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      pSVar21 = &pDVar15[iVar27].super_SVectorBase<double>;
                      pNVar5 = pSVar21->m_elem;
                      local_190[*(int *)((long)&pNVar5->idx + lVar19)] = iVar24;
                      local_78[iVar24] = local_78[iVar24] + 1;
                      local_1c8 = *(double *)((long)&pNVar5->val + lVar19);
                      uStack_1c0 = 0;
                      lVar28 = lVar28 + 1;
                      lVar19 = lVar19 + 0x10;
                    } while (lVar28 < pDVar15[iVar27].super_SVectorBase<double>.memused);
                  }
                  pDVar15[iVar27].super_SVectorBase<double>.memused = 0;
                  uVar20 = (ulong)(uint)(pIVar4->data).super_SVectorBase<double>.memused;
                }
                lVar25 = lVar25 + 1;
              } while (lVar25 < (int)uVar20);
            }
          }
          p_Var22 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&local_1e8->_vptr__Sp_counted_base + 1);
        } while ((long)p_Var22 <
                 (long)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      }
      free(idxMem);
      idxMem = (int *)0x0;
      iVar27 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      local_1a8 = (bool *)0x0;
      local_1a0 = 0x3ff3333333333333;
      compare.epsiloncompare._0_4_ = iVar27;
      if (iVar27 < 1) {
        compare.epsiloncompare._0_4_ = 0;
      }
      compare.epsiloncompare._4_4_ = compare.epsiloncompare._0_4_;
      if (iVar27 < 1) {
        compare.epsiloncompare._4_4_ = 1;
      }
      spx_alloc<bool*>(&local_1a8,compare.epsiloncompare._4_4_);
      local_94 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      local_90 = (bool *)0x0;
      local_88 = 0x3ff3333333333333;
      local_98 = local_94;
      if (local_94 < 1) {
        local_94 = 1;
        local_98 = 0;
      }
      spx_alloc<bool*>(&local_90,local_94);
      auVar11 = _DAT_005f4040;
      iVar27 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      if (0 < (long)iVar27) {
        pDVar15 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar25 = (long)iVar27 + -1;
        auVar34._8_4_ = (int)lVar25;
        auVar34._0_8_ = lVar25;
        auVar34._12_4_ = (int)((ulong)lVar25 >> 0x20);
        lVar25 = 0;
        auVar34 = auVar34 ^ _DAT_005f4040;
        auVar38 = _DAT_005f4020;
        auVar39 = _DAT_005f4030;
        do {
          auVar40 = auVar39 ^ auVar11;
          iVar23 = auVar34._4_4_;
          if ((bool)(~(auVar40._4_4_ == iVar23 && auVar34._0_4_ < auVar40._0_4_ ||
                      iVar23 < auVar40._4_4_) & 1)) {
            *(undefined4 *)((long)&(pDVar15->super_SVectorBase<double>).memused + lVar25) = 0;
          }
          if ((auVar40._12_4_ != auVar34._12_4_ || auVar40._8_4_ <= auVar34._8_4_) &&
              auVar40._12_4_ <= auVar34._12_4_) {
            *(undefined4 *)((long)&pDVar15[1].super_SVectorBase<double>.memused + lVar25) = 0;
          }
          auVar40 = auVar38 ^ auVar11;
          iVar24 = auVar40._4_4_;
          if (iVar24 <= iVar23 && (iVar24 != iVar23 || auVar40._0_4_ <= auVar34._0_4_)) {
            *(undefined4 *)((long)&pDVar15[2].super_SVectorBase<double>.memused + lVar25) = 0;
            *(undefined4 *)((long)&pDVar15[3].super_SVectorBase<double>.memused + lVar25) = 0;
          }
          lVar28 = auVar39._8_8_;
          auVar39._0_8_ = auVar39._0_8_ + 4;
          auVar39._8_8_ = lVar28 + 4;
          lVar28 = auVar38._8_8_;
          auVar38._0_8_ = auVar38._0_8_ + 4;
          auVar38._8_8_ = lVar28 + 4;
          lVar25 = lVar25 + 0x80;
        } while ((ulong)(iVar27 + 3U >> 2) << 7 != lVar25);
        if (0 < iVar27) {
          lVar25 = 0;
          do {
            local_1a8[lVar25] = false;
            local_90[lVar25] = false;
            DSVectorBase<double>::makeMem
                      ((this->m_dupCols).data.
                       super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_190[lVar25],1);
            lVar25 = lVar25 + 1;
          } while (lVar25 < (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
        }
      }
      local_60.data = (int *)0x0;
      local_60.memFactor = 1.2;
      local_60.thesize = 0;
      local_60.themax = 1;
      spx_alloc<int*>(&local_60.data,1);
      uVar3 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      uVar20 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar29 = 0;
      }
      else {
        this_00 = &this->m_hist;
        local_208 = *(element_type **)(in_FS_OFFSET + -8);
        uStack_200 = 0;
        peVar35 = (element_type *)-(double)local_208;
        pDVar15 = (this->m_dupCols).data.
                  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar25 = 0;
        uVar29 = 0;
        do {
          dVar30 = (double)(lVar25 * 0x20);
          local_e8 = lVar25;
          if ((1 < pDVar15[lVar25].super_SVectorBase<double>.memused) &&
             (local_1d8 = dVar30,
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem
             [(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
              [(pDVar15[lVar25].super_SVectorBase<double>.m_elem)->idx].idx].data.
             super_SVectorBase<double>.memused != 1)) {
            if ((uVar29 & 1) == 0) {
              pDVar16 = (DuplicateColsPS *)operator_new(0x78);
              DataArray<int>::DataArray(&local_b0,&local_60);
              local_108.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (this->super_SPxSimplifier<double>)._tolerances.
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_108.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (this->super_SPxSimplifier<double>)._tolerances.
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              if (local_108.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_108.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_108.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_108.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_108.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              DuplicateColsPS::DuplicateColsPS(pDVar16,lp,0,0,1.0,&local_b0,&local_108,true,false);
              ptr.
              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)pDVar16;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<double>::DuplicateColsPS*>
                        (&ptr.
                          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,pDVar16);
              if (local_108.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_108.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_b0.data != (int *)0x0) {
                free(local_b0.data);
                local_b0.data = (int *)0x0;
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
              ::push_back(&this_00->data,&ptr);
              if (ptr.
                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (ptr.
                           super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              pDVar15 = (this->m_dupCols).data.
                        super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar29 = CONCAT71((int7)(uVar29 >> 8),1);
            }
            if (0 < *(int *)((long)&(pDVar15->super_SVectorBase<double>).memused + (long)local_1d8))
            {
              local_1c8 = 0.0;
              local_f0 = uVar29;
              do {
                if (0 < *(int *)((long)&(pDVar15->super_SVectorBase<double>).memused +
                                (long)local_1d8)) {
                  lVar25 = (long)&pDVar15->_vptr_DSVectorBase + (long)local_1d8;
                  lVar28 = 8;
                  dVar30 = 0.0;
                  do {
                    if (local_1c8 != dVar30) {
                      uVar3 = *(uint *)(*(long *)(lVar25 + 8) + 8 + (long)local_1c8 * 0x10);
                      if (local_1a8[(int)uVar3] == false) {
                        _k = *(uint *)(*(long *)(lVar25 + 8) + lVar28);
                        if (local_1a8[(int)_k] == false) {
                          pdVar7 = (lp->super_LPColSetBase<double>).object.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                          dVar31 = pdVar7[(int)uVar3];
                          dVar37 = scale.data.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[(int)uVar3];
                          local_1e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                      scale.data.super__Vector_base<double,_std::allocator<double>_>
                                      ._M_impl.super__Vector_impl_data._M_start[(int)_k];
                          dVar2 = pdVar7[(int)_k];
                          dVar32 = epsZero(this);
                          dVar36 = dVar37 / (double)local_1e8;
                          dVar31 = dVar31 - (dVar2 * dVar37) / (double)local_1e8;
                          pdVar7 = (lp->super_LPColSetBase<double>).low.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start;
                          if (ABS(dVar31) <= dVar32) {
                            dVar31 = pdVar7[(int)uVar3];
                            pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                            p_Var22 = (this->super_SPxSimplifier<double>)._tolerances.
                                      super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi;
                            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                p_Var22->_M_use_count = p_Var22->_M_use_count + 1;
                              }
                            }
                            RVar33 = Tolerances::epsilon(pTVar6);
                            dVar37 = ABS(dVar31);
                            if (dVar37 <= 0.0) {
                              dVar37 = 0.0;
                            }
                            if (dVar37 <= 1.0) {
                              dVar37 = 1.0;
                            }
                            if (dVar31 / dVar37 <= RVar33) {
                              dVar31 = (lp->super_LPColSetBase<double>).up.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[(int)uVar3];
                              pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              this_01 = (this->super_SPxSimplifier<double>)._tolerances.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi;
                              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  this_01->_M_use_count = this_01->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  this_01->_M_use_count = this_01->_M_use_count + 1;
                                }
                              }
                              RVar33 = Tolerances::epsilon(pTVar6);
                              dVar37 = ABS(dVar31);
                              if (dVar37 <= 0.0) {
                                dVar37 = 0.0;
                              }
                              if (dVar37 <= 1.0) {
                                dVar37 = 1.0;
                              }
                              if (dVar31 / dVar37 <= -RVar33) {
                                bVar10 = false;
                              }
                              else {
                                local_1e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                            (lp->super_LPColSetBase<double>).low.val.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start[(int)_k];
                                uStack_1e0 = 0;
                                pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                this_02 = (this->super_SPxSimplifier<double>)._tolerances.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi;
                                if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    this_02->_M_use_count = this_02->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    this_02->_M_use_count = this_02->_M_use_count + 1;
                                  }
                                }
                                RVar33 = Tolerances::epsilon(pTVar6);
                                dVar31 = ABS((double)local_1e8);
                                if (dVar31 <= 0.0) {
                                  dVar31 = 0.0;
                                }
                                if (dVar31 <= 1.0) {
                                  dVar31 = 1.0;
                                }
                                if ((double)local_1e8 / dVar31 <= RVar33) {
                                  local_48 = (lp->super_LPColSetBase<double>).up.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[(int)_k];
                                  uStack_40 = 0;
                                  pTVar6 = (this->super_SPxSimplifier<double>)._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr;
                                  local_1e8 = (this->super_SPxSimplifier<double>)._tolerances.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi;
                                  if (local_1e8 !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      local_1e8->_M_use_count = local_1e8->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      local_1e8->_M_use_count = local_1e8->_M_use_count + 1;
                                    }
                                  }
                                  RVar33 = Tolerances::epsilon(pTVar6);
                                  dVar31 = ABS(local_48);
                                  if (dVar31 <= 0.0) {
                                    dVar31 = 0.0;
                                  }
                                  if (dVar31 <= 1.0) {
                                    dVar31 = 1.0;
                                  }
                                  bVar10 = -RVar33 < local_48 / dVar31;
                                  if (local_1e8 !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                              (local_1e8);
                                  }
                                }
                                else {
                                  bVar10 = false;
                                }
                                if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (this_02);
                                }
                              }
                              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (this_01);
                              }
                            }
                            else {
                              bVar10 = false;
                            }
                            if (p_Var22 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var22)
                              ;
                            }
                            if (bVar10) {
                              pDVar16 = (DuplicateColsPS *)operator_new(0x78);
                              DataArray<int>::DataArray(&local_c8,&local_60);
                              local_118.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                              local_118.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi =
                                   (this->super_SPxSimplifier<double>)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                              if (local_118.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  (local_118.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_118.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  (local_118.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_118.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                }
                              }
                              DuplicateColsPS::DuplicateColsPS
                                        (pDVar16,lp,uVar3,_k,dVar36,&local_c8,&local_118,false,false
                                        );
                              ptr.
                              super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr = (element_type *)pDVar16;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                              __shared_count<soplex::SPxMainSM<double>::DuplicateColsPS*>
                                        (&ptr.
                                          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,pDVar16);
                              if (local_118.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_118.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                              if (local_c8.data != (int *)0x0) {
                                free(local_c8.data);
                                local_c8.data = (int *)0x0;
                              }
                              std::
                              vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                              ::push_back(&this_00->data,&ptr);
                              if (dVar36 <= 0.0) {
                                if (dVar36 < 0.0) {
                                  dVar31 = (lp->super_LPColSetBase<double>).low.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)_k];
                                  ::soplex::infinity::__tls_init();
                                  if ((dVar31 <= (double)peVar35) ||
                                     (dVar31 = (lp->super_LPColSetBase<double>).up.val.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start[(int)uVar3],
                                     ::soplex::infinity::__tls_init(), (double)local_208 <= dVar31))
                                  {
                                    ::soplex::infinity::__tls_init();
                                    ptr_6.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = peVar35;
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2a])(lp,(ulong)_k,&ptr_6,0);
                                  }
                                  else {
                                    ptr_6.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (element_type *)
                                              ((lp->super_LPColSetBase<double>).up.val.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start[(int)uVar3]
                                               * dVar36 +
                                              (lp->super_LPColSetBase<double>).low.val.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start[(int)_k]);
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2a])(lp,(ulong)_k,&ptr_6,0);
                                  }
                                  dVar31 = (lp->super_LPColSetBase<double>).up.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)_k];
                                  ::soplex::infinity::__tls_init();
                                  if (((double)local_208 <= dVar31) ||
                                     (dVar31 = (lp->super_LPColSetBase<double>).low.val.
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start[(int)uVar3],
                                     ::soplex::infinity::__tls_init(), dVar31 <= (double)peVar35)) {
                                    ::soplex::infinity::__tls_init();
                                    ptr_6.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = local_208;
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2d])(lp,(ulong)_k,&ptr_6,0);
                                  }
                                  else {
                                    ptr_6.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (element_type *)
                                              (dVar36 * (lp->super_LPColSetBase<double>).low.val.
                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar3] +
                                              (lp->super_LPColSetBase<double>).up.val.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start[(int)_k]);
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2d])(lp,(ulong)_k,&ptr_6,0);
                                  }
                                }
                              }
                              else {
                                dVar31 = (lp->super_LPColSetBase<double>).low.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[(int)_k];
                                ::soplex::infinity::__tls_init();
                                if ((dVar31 <= (double)peVar35) ||
                                   (dVar31 = (lp->super_LPColSetBase<double>).low.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[(int)uVar3],
                                   ::soplex::infinity::__tls_init(), dVar31 <= (double)peVar35)) {
                                  ::soplex::infinity::__tls_init();
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = peVar35;
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2a])(lp,(ulong)_k,&ptr_6,0);
                                }
                                else {
                                  pdVar7 = (lp->super_LPColSetBase<double>).low.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start;
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (element_type *)
                                            (pdVar7[(int)uVar3] * dVar36 + pdVar7[(int)_k]);
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2a])(lp,(ulong)_k,&ptr_6,0);
                                }
                                dVar31 = (lp->super_LPColSetBase<double>).up.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[(int)_k];
                                ::soplex::infinity::__tls_init();
                                if (((double)local_208 <= dVar31) ||
                                   (dVar31 = (lp->super_LPColSetBase<double>).up.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[(int)uVar3],
                                   ::soplex::infinity::__tls_init(), (double)local_208 <= dVar31)) {
                                  ::soplex::infinity::__tls_init();
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = local_208;
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2d])(lp,(ulong)_k,&ptr_6,0);
                                }
                                else {
                                  pdVar7 = (lp->super_LPColSetBase<double>).up.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start;
                                  ptr_6.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr = (element_type *)
                                            (dVar36 * pdVar7[(int)uVar3] + pdVar7[(int)_k]);
                                  (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                    [0x2d])(lp,(ulong)_k,&ptr_6,0);
                                }
                              }
                              local_1a8[(int)uVar3] = true;
                              piVar9 = (this->m_stat).data + 0xe;
                              *piVar9 = *piVar9 + 1;
                              if (ptr.
                                  super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (ptr.
                                           super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                              }
                            }
                          }
                          else {
                            dVar37 = pdVar7[(int)_k];
                            ::soplex::infinity::__tls_init();
                            if (dVar37 <= (double)peVar35) {
                              if ((dVar36 <= 0.0) || (dVar31 <= 0.0)) {
                                if ((dVar36 < 0.0) && (dVar31 < 0.0)) {
                                  dVar31 = (lp->super_LPColSetBase<double>).low.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)uVar3];
                                  ::soplex::infinity::__tls_init();
                                  if ((double)peVar35 < dVar31) {
                                    pdVar7 = (lp->super_LPColSetBase<double>).low.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start;
                                    pFVar17 = (FixBoundsPS *)operator_new(0x30);
                                    dVar31 = pdVar7[(int)uVar3];
                                    local_138.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr;
                                    local_138.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi =
                                         (this->super_SPxSimplifier<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi;
                                    if (local_138.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      if (__libc_single_threaded == '\0') {
                                        LOCK();
                                        (local_138.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_138.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                        UNLOCK();
                                      }
                                      else {
                                        (local_138.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_138.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                      }
                                    }
                                    FixBoundsPS::FixBoundsPS(pFVar17,lp,uVar3,dVar31,&local_138);
                                    ptr.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (element_type *)pFVar17;
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                    __shared_count<soplex::SPxMainSM<double>::FixBoundsPS*>
                                              (&ptr.
                                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount,pFVar17);
                                    if (local_138.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                                (local_138.
                                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi);
                                    }
                                    std::
                                    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                                    ::push_back(&this_00->data,&ptr);
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2d])(lp,(ulong)uVar3,
                                              (lp->super_LPColSetBase<double>).low.val.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + (int)uVar3,
                                              0);
                                    goto joined_r0x001f18d9;
                                  }
                                  goto LAB_001f1b22;
                                }
                              }
                              else {
                                dVar31 = (lp->super_LPColSetBase<double>).up.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[(int)uVar3];
                                ::soplex::infinity::__tls_init();
                                if ((double)local_208 <= dVar31) {
LAB_001f1b22:
                                  RVar12 = UNBOUNDED;
                                  goto LAB_001f1e57;
                                }
                                pdVar7 = (lp->super_LPColSetBase<double>).up.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start;
                                pFVar17 = (FixBoundsPS *)operator_new(0x30);
                                dVar31 = pdVar7[(int)uVar3];
                                local_128.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr;
                                local_128.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi =
                                     (this->super_SPxSimplifier<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                                if (local_128.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    (local_128.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_128.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    (local_128.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_128.
                                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                  }
                                }
                                FixBoundsPS::FixBoundsPS(pFVar17,lp,uVar3,dVar31,&local_128);
                                ptr.
                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr = (element_type *)pFVar17;
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                __shared_count<soplex::SPxMainSM<double>::FixBoundsPS*>
                                          (&ptr.
                                            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,pFVar17);
                                if (local_128.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_128.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
                                }
                                std::
                                vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                                ::push_back(&this_00->data,&ptr);
                                (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                  super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2a])
                                          (lp,(ulong)uVar3,
                                           (lp->super_LPColSetBase<double>).up.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start + (int)uVar3,0);
joined_r0x001f18d9:
                                if (ptr.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (ptr.
                                             super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
                                }
                              }
                            }
                            else {
                              dVar37 = (lp->super_LPColSetBase<double>).up.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start[(int)_k];
                              ::soplex::infinity::__tls_init();
                              if ((double)local_208 <= dVar37) {
                                if ((0.0 <= dVar36) || (dVar31 <= 0.0)) {
                                  if ((dVar36 <= 0.0) || (0.0 <= dVar31)) goto LAB_001f19fc;
                                  dVar31 = (lp->super_LPColSetBase<double>).low.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)uVar3];
                                  ::soplex::infinity::__tls_init();
                                  if ((double)peVar35 < dVar31) {
                                    pdVar7 = (lp->super_LPColSetBase<double>).low.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start;
                                    pFVar17 = (FixBoundsPS *)operator_new(0x30);
                                    dVar31 = pdVar7[(int)uVar3];
                                    local_158.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr;
                                    local_158.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi =
                                         (this->super_SPxSimplifier<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi;
                                    if (local_158.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      if (__libc_single_threaded == '\0') {
                                        LOCK();
                                        (local_158.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_158.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                        UNLOCK();
                                      }
                                      else {
                                        (local_158.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_158.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                      }
                                    }
                                    FixBoundsPS::FixBoundsPS(pFVar17,lp,uVar3,dVar31,&local_158);
                                    ptr.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (element_type *)pFVar17;
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                    __shared_count<soplex::SPxMainSM<double>::FixBoundsPS*>
                                              (&ptr.
                                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount,pFVar17);
                                    if (local_158.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                                (local_158.
                                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi);
                                    }
                                    std::
                                    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                                    ::push_back(&this_00->data,&ptr);
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2d])(lp,(ulong)uVar3,
                                              (lp->super_LPColSetBase<double>).low.val.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + (int)uVar3,
                                              0);
                                    goto joined_r0x001f18d9;
                                  }
                                }
                                else {
                                  dVar31 = (lp->super_LPColSetBase<double>).up.val.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[(int)uVar3];
                                  ::soplex::infinity::__tls_init();
                                  if (dVar31 < (double)local_208) {
                                    pdVar7 = (lp->super_LPColSetBase<double>).up.val.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start;
                                    pFVar17 = (FixBoundsPS *)operator_new(0x30);
                                    dVar31 = pdVar7[(int)uVar3];
                                    local_148.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (this->super_SPxSimplifier<double>)._tolerances.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr;
                                    local_148.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi =
                                         (this->super_SPxSimplifier<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi;
                                    if (local_148.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      if (__libc_single_threaded == '\0') {
                                        LOCK();
                                        (local_148.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_148.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                        UNLOCK();
                                      }
                                      else {
                                        (local_148.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi)->_M_use_count =
                                             (local_148.
                                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_M_use_count + 1;
                                      }
                                    }
                                    FixBoundsPS::FixBoundsPS(pFVar17,lp,uVar3,dVar31,&local_148);
                                    ptr.
                                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr = (element_type *)pFVar17;
                                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                    __shared_count<soplex::SPxMainSM<double>::FixBoundsPS*>
                                              (&ptr.
                                                super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount,pFVar17);
                                    if (local_148.
                                        super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi !=
                                        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                                (local_148.
                                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi);
                                    }
                                    std::
                                    vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                                    ::push_back(&this_00->data,&ptr);
                                    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
                                      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray
                                      [0x2a])(lp,(ulong)uVar3,
                                              (lp->super_LPColSetBase<double>).up.val.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + (int)uVar3,
                                              0);
                                    goto joined_r0x001f18d9;
                                  }
                                }
                                goto LAB_001f1b22;
                              }
                            }
LAB_001f19fc:
                            dVar31 = (lp->super_LPColSetBase<double>).low.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[(int)uVar3];
                            dVar37 = (lp->super_LPColSetBase<double>).up.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[(int)uVar3];
                            dVar36 = feastol(this);
                            uVar20 = (ulong)DAT_005f4110;
                            dVar32 = (double)((ulong)dVar31 & uVar20);
                            dVar2 = (double)((ulong)dVar37 & uVar20);
                            if (dVar32 <= dVar2) {
                              dVar32 = dVar2;
                            }
                            if (dVar32 <= 1.0) {
                              dVar32 = 1.0;
                            }
                            if ((double)((ulong)((dVar31 - dVar37) / dVar32) & uVar20) <= dVar36) {
                              local_1a8[(int)uVar3] = true;
                              local_90[(int)uVar3] = true;
                              piVar9 = (this->m_stat).data + 0xd;
                              *piVar9 = *piVar9 + 1;
                            }
                          }
                        }
                      }
                    }
                    dVar30 = (double)((long)dVar30 + 1);
                    pDVar15 = (this->m_dupCols).data.
                              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    lVar25 = (long)&pDVar15->_vptr_DSVectorBase + (long)local_1d8;
                    lVar28 = lVar28 + 0x10;
                  } while ((long)dVar30 < (long)*(int *)(lVar25 + 0x14));
                }
                local_1c8 = (double)((long)local_1c8 + 1);
                uVar29 = local_f0;
              } while ((long)local_1c8 <
                       (long)*(int *)((long)&(pDVar15->super_SVectorBase<double>).memused +
                                     (long)local_1d8));
            }
          }
          lVar25 = local_e8 + 1;
          iVar27 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
          uVar20 = (ulong)iVar27;
        } while (lVar25 < (long)uVar20);
        if (0 < iVar27) {
          lVar25 = 0;
          do {
            if (local_90[lVar25] == true) {
              fixColumn(this,lp,(int)lVar25,false);
              uVar20 = (ulong)(uint)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.
                                    thenum;
            }
            lVar25 = lVar25 + 1;
          } while (lVar25 < (int)uVar20);
        }
      }
      perm = (int *)0x0;
      iVar27 = (int)uVar20;
      spx_alloc<int*>(&perm,iVar27);
      uVar20 = uVar20 & 0xffffffff;
      if (iVar27 < 1) {
        iVar24 = 0;
        iVar23 = 0;
      }
      else {
        pIVar4 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
        pDVar8 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey;
        uVar26 = 0;
        iVar23 = 0;
        iVar24 = 0;
        do {
          if (local_1a8[uVar26] == true) {
            perm[uVar26] = -1;
            iVar23 = iVar23 + 1;
            iVar24 = iVar24 + pIVar4[pDVar8[uVar26].idx].data.super_SVectorBase<double>.memused;
          }
          else {
            perm[uVar26] = 0;
          }
          uVar26 = uVar26 + 1;
        } while (uVar20 != uVar26);
      }
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x17])(lp,perm);
      if (0 < iVar27) {
        piVar9 = (this->m_cIdx).data;
        uVar26 = 0;
        do {
          if (-1 < (long)perm[uVar26]) {
            piVar9[perm[uVar26]] = piVar9[uVar26];
          }
          uVar26 = uVar26 + 1;
        } while (uVar20 != uVar26);
      }
      ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar13 = 0;
      if (0 < iVar27) {
        iVar13 = iVar27;
      }
      n = 1;
      if (0 < iVar27) {
        n = iVar13;
      }
      ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)CONCAT44(n,iVar13);
      spx_alloc<int*>((int **)&ptr.
                               super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,n);
      if (0 < iVar27) {
        uVar26 = 0;
        do {
          *(int *)((long)&(ptr.
                           super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi)->_vptr__Sp_counted_base + uVar26 * 4) = perm[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar20 != uVar26);
      }
      if ((uVar29 & 1) != 0) {
        pDVar16 = (DuplicateColsPS *)operator_new(0x78);
        DataArray<int>::DataArray(&local_e0,(DataArray<int> *)&ptr);
        local_168.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->super_SPxSimplifier<double>)._tolerances.
             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_168.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (this->super_SPxSimplifier<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (local_168.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_168.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_168.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_168.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_168.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        DuplicateColsPS::DuplicateColsPS(pDVar16,lp,0,0,1.0,&local_e0,&local_168,false,true);
        ptr_6.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)pDVar16;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<double>::DuplicateColsPS*>
                  (&ptr_6.
                    super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,pDVar16);
        if (local_168.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_168.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_e0.data != (int *)0x0) {
          free(local_e0.data);
          local_e0.data = (int *)0x0;
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
        ::push_back(&(this->m_hist).data,&ptr_6);
        if (ptr_6.
            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (ptr_6.
                     super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      free(perm);
      perm = (int *)0x0;
      if (0 < iVar23) {
        piVar9 = &(this->super_SPxSimplifier<double>).m_remCols;
        *piVar9 = *piVar9 + iVar23;
        piVar9 = &(this->super_SPxSimplifier<double>).m_remNzos;
        *piVar9 = *piVar9 + iVar24;
        pSVar18 = (this->super_SPxSimplifier<double>).spxout;
        if ((pSVar18 != (SPxOut *)0x0) && (3 < (int)pSVar18->m_verbosity)) {
          ptr_6.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)
                   CONCAT44(ptr_6.
                            super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr._4_4_,pSVar18->m_verbosity);
          local_64 = 4;
          (*pSVar18->_vptr_SPxOut[2])();
          pSVar18 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                       "Simplifier (duplicate columns) removed ");
          std::ostream::operator<<((ostream *)pSVar18->m_streams[pSVar18->m_verbosity],iVar23);
          pSVar18 = soplex::operator<<(pSVar18," cols, ");
          std::ostream::operator<<((ostream *)pSVar18->m_streams[pSVar18->m_verbosity],iVar24);
          pSVar18 = soplex::operator<<(pSVar18," non-zeros");
          std::endl<char,std::char_traits<char>>(pSVar18->m_streams[pSVar18->m_verbosity]);
          pSVar18 = (this->super_SPxSimplifier<double>).spxout;
          (*pSVar18->_vptr_SPxOut[2])(pSVar18,&ptr_6);
        }
        if ((double)iVar27 * (this->super_SPxSimplifier<double>).m_minReduction < (double)iVar23) {
          *local_f8 = true;
        }
      }
      if (ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        free(ptr.super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
      }
      RVar12 = OKAY;
LAB_001f1e57:
      if (local_60.data != (int *)0x0) {
        free(local_60.data);
      }
      if (local_90 != (bool *)0x0) {
        free(local_90);
      }
      if (local_1a8 != (bool *)0x0) {
        free(local_1a8);
      }
      if (scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)scale.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      if (local_78 != (int *)0x0) {
        free(local_78);
      }
      if (local_190 != (int *)0x0) {
        free(local_190);
      }
    }
  }
  return RVar12;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateCols(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate columns
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   int remCols = 0;
   int remNzos = 0;

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

   if(lp.nCols() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nCols());          // class of parallel columns
   DataArray<int>    classSize(lp.nCols());       // size of each class
   Array<R>   scale(lp.nCols());           // scaling factor for each column
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nCols());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nCols(), idxMem);  // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nCols();

   for(int j = 1; j < lp.nCols(); ++j)
   {
      pClass[j] = 0;
      scale[j]  = 0.0;
      classSize[j] = 0;
      idxSet.addIdx(j);
   }

   R oldVal = 0.0;

   // main loop
   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      for(int k = 0; k < row.size(); ++k)
      {
         R aij = row.value(k);
         int  j   = row.index(k);

         if(scale[j] == 0.0)
            scale[j] = aij;

         m_classSetCols[pClass[j]].add(j, aij / scale[j]);

         if(--classSize[pClass[j]] == 0)
            idxSet.addIdx(pClass[j]);
      }

      // update each parallel class with non-zero row entry
      for(int m = 0; m < row.size(); ++m)
      {
         int k = pClass[row.index(m)];

         if(m_classSetCols[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled row values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetCols[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetCols[k].hasNaNs());
               assert(!m_classSetCols[k].hasInfs());
               SPxQuicksort(m_classSetCols[k].mem(), m_classSetCols[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetCols[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetCols[k].value(l), oldVal, this->epsZero()))
               {
                  // start new parallel class
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetCols[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetCols[k].value(l);
            }

            m_classSetCols[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remCol(lp.nCols());
   DataArray<bool> fixAndRemCol(lp.nCols());

   for(int k = 0; k < lp.nCols(); ++k)
      m_dupCols[k].clear();

   for(int k = 0; k < lp.nCols(); ++k)
   {
      remCol[k] = false;
      fixAndRemCol[k] = false;
      m_dupCols[pClass[k]].add(k, 0.0);
   }

   bool hasDuplicateCol = false;
   DataArray<int>  m_perm_empty(0);

   for(int k = 0; k < lp.nCols(); ++k)
   {
      if(m_dupCols[k].size() > 1 && !(lp.colVector(m_dupCols[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM58 {} duplicate columns found\n", m_dupCols[k].size());

         if(!hasDuplicateCol)
         {
            std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, m_perm_empty, this->_tolerances,
                                          true));
            m_hist.append(ptr);
            hasDuplicateCol = true;
         }

         for(int l = 0; l < m_dupCols[k].size(); ++l)
         {
            for(int m = 0; m < m_dupCols[k].size(); ++m)
            {
               int j1  = m_dupCols[k].index(l);
               int j2  = m_dupCols[k].index(m);

               if(l != m && !remCol[j1] && !remCol[j2])
               {
                  R cj1 = lp.maxObj(j1);
                  R cj2 = lp.maxObj(j2);

                  // A.j1 = factor * A.j2
                  R factor = scale[j1] / scale[j2];
                  R objDif = cj1 - cj2 * scale[j1] / scale[j2];

                  SOPLEX_ASSERT_WARN("WMAISM59", isNotZero(factor, this->epsZero()));

                  if(isZero(objDif, this->epsZero()))
                  {
                     // case 1: objectives also duplicate

                     // if 0 is not within the column bounds, we are not able to postsolve if the aggregated column has
                     // status ZERO, hence we skip this case
                     if(LErel(lp.lower(j1), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j1), R(0.0), this->tolerances()->epsilon())
                           && LErel(lp.lower(j2), R(0.0), this->tolerances()->epsilon())
                           && GErel(lp.upper(j2), R(0.0), this->tolerances()->epsilon()))
                     {
                        std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, j1, j2, factor, m_perm_empty,
                                                      this->_tolerances));
                        // variable substitution xj2' := xj2 + factor * xj1 <=> xj2 = -factor * xj1 + xj2'
                        m_hist.append(ptr);

                        // update bounds of remaining column j2 (new column j2')
                        if(factor > 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.lower(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.upper(j1));
                        }
                        else if(factor < 0)
                        {
                           if(lp.lower(j2) <= R(-infinity) || lp.upper(j1) >= R(infinity))
                              lp.changeLower(j2, R(-infinity));
                           else
                              lp.changeLower(j2, lp.lower(j2) + factor * lp.upper(j1));

                           if(lp.upper(j2) >= R(infinity) || lp.lower(j1) <= R(-infinity))
                              lp.changeUpper(j2, R(infinity));
                           else
                              lp.changeUpper(j2, lp.upper(j2) + factor * lp.lower(j1));
                        }

                        SPxOut::debug(this, "IMAISM60 two duplicate columns {}, {} replaced by one\n", j1, j2);

                        remCol[j1] = true;

                        ++m_stat[SUB_DUPLICATE_COL];
                     }
                     else
                     {
                        SPxOut::debug(this,
                                      "IMAISM80 not removing two duplicate columns {}, {} because zero not contained in their bounds\n",
                                      j1, j2);
                     }
                  }
                  else
                  {
                     // case 2: objectives not duplicate
                     // considered for maximization sense
                     if(lp.lower(j2) <= R(-infinity))
                     {
                        if(factor > 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM75 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM61 two duplicate columns {}, {} first one fixed at upper bound={}\n", j1,
                                         j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }
                        else if(factor < 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM76 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM62 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }
                     else if(lp.upper(j2) >= R(infinity))
                     {
                        // fix j1 at upper bound
                        if(factor < 0 && objDif > 0)
                        {
                           if(lp.upper(j1) >= R(infinity))
                           {
                              SPxOut::debug(this, "IMAISM77 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at upper bound
                           SPxOut::debug(this, "IMAISM63 two duplicate columns {}, {},  first one fixed at upper bound={}\n",
                                         j1, j2, lp.upper(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.upper(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeLower(j1, lp.upper(j1));
                        }

                        // fix j1 at lower bound
                        else if(factor > 0 && objDif < 0)
                        {
                           if(lp.lower(j1) <= R(-infinity))
                           {
                              SPxOut::debug(this, "IMAISM78 LP unbounded\n");
                              return this->UNBOUNDED;
                           }

                           // fix j1 at lower bound
                           SPxOut::debug(this, "IMAISM64 two duplicate columns {}, {} first one fixed at lower bound={}\n", j1,
                                         j2, lp.lower(j1));

                           std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j1, lp.lower(j1), this->_tolerances));
                           m_hist.append(ptr);
                           lp.changeUpper(j1, lp.lower(j1));
                        }
                     }

                     if(EQrel(lp.lower(j1), lp.upper(j1), feastol()))
                     {
                        remCol[j1] = true;
                        fixAndRemCol[j1] = true;

                        ++m_stat[FIX_DUPLICATE_COL];
                     }
                  }
               }
            }
         }
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(fixAndRemCol[j])
      {
         assert(remCol[j]);

         // correctIdx == false, because the index mapping will be handled by the postsolving in DuplicateColsPS
         fixColumn(lp, j, false);
      }
   }

   // remove all columns by one single method call (more efficient)
   const int nColsOld = lp.nCols();
   int* perm = nullptr;
   spx_alloc(perm, nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(remCol[j])
      {
         perm[j] = -1;
         ++remCols;
         remNzos += lp.colVector(j).size();
      }
      else
         perm[j] = 0;
   }

   lp.removeCols(perm);

   for(int j = 0; j < nColsOld; ++j)
   {
      if(perm[j] >= 0)
         m_cIdx[perm[j]] = m_cIdx[j];
   }

   DataArray<int> da_perm(nColsOld);

   for(int j = 0; j < nColsOld; ++j)
   {
      da_perm[j] = perm[j];
   }

   if(hasDuplicateCol)
   {
      std::shared_ptr<PostStep> ptr(new DuplicateColsPS(lp, 0, 0, 1.0, da_perm, this->_tolerances, false,
                                    true));
      m_hist.append(ptr);
   }

   spx_free(perm);

   assert(remCols > 0 || remNzos == 0);

   if(remCols > 0)
   {
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate columns) removed "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols > this->m_minReduction * nColsOld)
         again = true;
   }

   return this->OKAY;
}